

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Game::buyCardsComputer(Game *this,Player *player)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  Cards card;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  CardType local_1c0;
  int iStack_1bc;
  vector<int,_std::allocator<int>_> local_1b8;
  iterator local_1a0;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  CardType local_150;
  int iStack_14c;
  vector<int,_std::allocator<int>_> local_148;
  iterator local_130;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  CardType local_e0;
  int iStack_dc;
  vector<int,_std::allocator<int>_> local_d8;
  iterator local_c0;
  vector<Cards,_std::allocator<Cards>_> local_b8;
  Cards local_a0;
  
  DeckOfCards::topThreeCards(&local_b8,&this->deckOfCards);
  if (local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_208._0_4_ =
         (local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data
         ._M_start)->id;
    local_200._M_p = (pointer)&local_1f0;
    pcVar1 = ((local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
               super__Vector_impl_data._M_start)->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar1,
               pcVar1 + ((local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                          super__Vector_impl_data._M_start)->name)._M_string_length);
    pcVar1 = ((local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
               super__Vector_impl_data._M_start)->description)._M_dataplus._M_p;
    local_1e0._M_p = (pointer)&local_1d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,
               pcVar1 + ((local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                          super__Vector_impl_data._M_start)->description)._M_string_length);
    local_1c0 = (local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                 super__Vector_impl_data._M_start)->type;
    iStack_1bc = (local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                  super__Vector_impl_data._M_start)->energyCost;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1b8,
               &(local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                 super__Vector_impl_data._M_start)->effect);
    local_1a0._M_current =
         ((local_b8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start)->it)._M_current;
    iVar2 = Cards::getEnergyCost((Cards *)local_208);
    iVar3 = Player::getEnergyCubes(player);
    if (iVar2 < iVar3) {
      local_128._0_4_ = local_208._0_4_;
      local_120._M_p = (pointer)&local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_200._M_p,local_200._M_p + local_1f8);
      local_100._M_p = (pointer)&local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_1e0._M_p,local_1e0._M_p + local_1d8);
      local_e0 = local_1c0;
      iStack_dc = iStack_1bc;
      std::vector<int,_std::allocator<int>_>::vector(&local_d8,&local_1b8);
      local_c0._M_current = local_1a0._M_current;
      DeckOfCards::draw(&local_a0,&this->deckOfCards,(Cards *)local_128);
      if (local_a0.effect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.effect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.effect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.effect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.description._M_dataplus._M_p != &local_a0.description.field_2) {
        operator_delete(local_a0.description._M_dataplus._M_p,
                        local_a0.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
        operator_delete(local_a0.name._M_dataplus._M_p,
                        local_a0.name.field_2._M_allocated_capacity + 1);
      }
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_p != &local_110) {
        operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
      }
      local_198._0_4_ = local_208._0_4_;
      local_190._M_p = (pointer)&local_180;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_200._M_p,local_200._M_p + local_1f8);
      local_170._M_p = (pointer)&local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_1e0._M_p,local_1e0._M_p + local_1d8);
      local_150 = local_1c0;
      iStack_14c = iStack_1bc;
      std::vector<int,_std::allocator<int>_>::vector(&local_148,&local_1b8);
      local_130._M_current = local_1a0._M_current;
      Player::buyCards(player,(Cards *)local_198);
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot afford any cards",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_p != &local_1f0) {
      operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
    }
  }
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&local_b8);
  return;
}

Assistant:

void Game::buyCardsComputer(Player* player) {
    for(Cards card: deckOfCards.topThreeCards()) {
        if(card.getEnergyCost() < player->getEnergyCubes()){
            deckOfCards.draw(card);
            player->buyCards(card);
            return;
        }
        else{
            cout << "Cannot afford any cards" << endl;
            return;
        }
    }
}